

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O3

void __thiscall
HMatrix::setup_lgBs(HMatrix *this,int numCol_,int numRow_,int *Astart_,int *Aindex_,double *Avalue_)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar2;
  pointer piVar3;
  int *piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  size_type sVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  size_type __new_size;
  value_type local_34;
  
  this->numCol = numCol_;
  this->numRow = numRow_;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->Astart,Astart_,Astart_ + (long)numCol_ + 1);
  __new_size = (size_type)(Astart_ + (long)numCol_ + 1)[-1];
  pvVar1 = &this->Aindex;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)pvVar1,Aindex_,Aindex_ + __new_size);
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->Avalue,Avalue_,Avalue_ + __new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARstart,(long)this->numRow + 1);
  this_00 = &this->AR_Nend;
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(this_00,(long)this->numRow,&local_34);
  if (0 < (long)__new_size) {
    piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = 0;
    do {
      piVar4 = piVar3 + piVar2[sVar9];
      *piVar4 = *piVar4 + 1;
      sVar9 = sVar9 + 1;
    } while (__new_size != sVar9);
  }
  piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar2 = 0;
  if (0 < this->numRow) {
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    iVar12 = 0;
    do {
      iVar12 = iVar12 + piVar3[lVar10];
      piVar2[lVar10 + 1] = iVar12;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numRow);
    if (0 < this->numRow) {
      piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        piVar3[lVar10] = piVar2[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 < this->numRow);
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue,__new_size);
  iVar12 = this->numCol;
  if (0 < iVar12) {
    piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = *piVar4;
    lVar10 = 0;
    do {
      lVar13 = lVar10 + 1;
      iVar8 = piVar4[lVar10 + 1];
      if (iVar11 < piVar4[lVar10 + 1]) {
        lVar14 = (long)iVar11;
        do {
          iVar12 = piVar2[lVar14];
          iVar11 = piVar3[iVar12];
          piVar3[iVar12] = iVar11 + 1;
          piVar5[iVar11] = (int)lVar10;
          pdVar7[iVar11] = pdVar6[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 < piVar4[lVar13]);
        iVar12 = this->numCol;
        iVar8 = piVar4[lVar13];
      }
      iVar11 = iVar8;
      lVar10 = lVar13;
    } while (lVar13 < iVar12);
  }
  return;
}

Assistant:

void HMatrix::setup_lgBs(int numCol_, int numRow_, const int *Astart_,
			 const int *Aindex_, const double *Avalue_) {
  //Copy the A matrix and setup row-wise matrix with the nonbasic
  //columns before the basic columns for a logical basis
  //
  //Copy A
  numCol = numCol_;
  numRow = numRow_;
  Astart.assign(Astart_, Astart_ + numCol_ + 1);
  
  int AcountX = Astart_[numCol_];
  Aindex.assign(Aindex_, Aindex_ + AcountX);
  Avalue.assign(Avalue_, Avalue_ + AcountX);
  
  // Build row copy - pointers
  ARstart.resize(numRow + 1);
  AR_Nend.assign(numRow, 0);
  for (int k = 0; k < AcountX; k++)
    AR_Nend[Aindex[k]]++;
  ARstart[0] = 0;
  for (int i = 1; i <= numRow; i++)
    ARstart[i] = ARstart[i - 1] + AR_Nend[i - 1];
  for (int i = 0; i < numRow; i++)
    AR_Nend[i] = ARstart[i];
  
  // Build row copy - elements
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (int iCol = 0; iCol < numCol; iCol++) {
    for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      int iRow = Aindex[k];
      int iPut = AR_Nend[iRow]++;
      ARindex[iPut] = iCol;
      ARvalue[iPut] = Avalue[k];
    }
  }
}